

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid.cpp
# Opt level: O2

string * __thiscall
ApprovalTests::Grid::print_abi_cxx11_
          (string *__return_storage_ptr__,Grid *this,int width,int height,
          function<void_(int,_int,_std::basic_ostream<char,_std::char_traits<char>_>_&)> *printCell)

{
  undefined4 in_register_0000000c;
  int x;
  int __args;
  int __args_1;
  int iVar1;
  stringstream s;
  ostream local_1a8;
  
  iVar1 = (int)this;
  ::std::__cxx11::stringstream::stringstream((stringstream *)&s);
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  __args_1 = 0;
  if (width < 1) {
    width = 0;
    __args_1 = 0;
  }
  for (; __args_1 != width; __args_1 = __args_1 + 1) {
    for (__args = 0; iVar1 != __args; __args = __args + 1) {
      ::std::function<void_(int,_int,_std::basic_ostream<char,_std::char_traits<char>_>_&)>::
      operator()((function<void_(int,_int,_std::basic_ostream<char,_std::char_traits<char>_>_&)> *)
                 CONCAT44(in_register_0000000c,height),__args,__args_1,&local_1a8);
    }
    ::std::operator<<(&local_1a8,'\n');
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&s);
  return __return_storage_ptr__;
}

Assistant:

std::string Grid::print(int width,
                            int height,
                            std::function<void(int, int, std::ostream&)> printCell)
    {
        std::stringstream s;
        for (int y = 0; y < height; ++y)
        {
            for (int x = 0; x < width; ++x)
            {
                printCell(x, y, s);
            }
            s << '\n';
        }
        return s.str();
    }